

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterative_method.c
# Opt level: O2

void Iterative_method_BiCGSTAB
               (Sparse_matrix *matrix,double *x,double *b,uint max_iter,Precond_type precond,
               double omega_precond,double accuracy,double *buffer)

{
  double *v1;
  double *newVector;
  double *vector;
  double *vector_00;
  double *v2;
  double *newVector_00;
  size_t __n;
  uint size;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  size = matrix->size;
  uVar7 = (ulong)size;
  v1 = buffer + uVar7;
  uVar2 = size * 2;
  newVector = buffer + uVar2;
  uVar1 = size * 3;
  dVar9 = scalar_product(b,b,size);
  Sparse_matrix_Apply_to_vector(matrix,x,buffer);
  __n = uVar7 * 8;
  memset(newVector,0,__n);
  memset(buffer + uVar1,0,__n);
  for (lVar6 = 0; __n - lVar6 != 0; lVar6 = lVar6 + 8) {
    dVar10 = *(double *)((long)b + lVar6) - *(double *)((long)buffer + lVar6);
    *(double *)((long)buffer + lVar6) = dVar10;
    *(double *)((long)v1 + lVar6) = dVar10;
  }
  vector = buffer + size * 4;
  vector_00 = buffer + size * 5;
  v2 = buffer + size * 6;
  newVector_00 = buffer + size * 7;
  dVar13 = 1.0;
  uVar3 = 1;
  dVar12 = 1.0;
  dVar10 = 1.0;
  while( true ) {
    if (max_iter <= uVar3) {
      printf("\nWarning: maximum number of iterations reached: %u.\n",(ulong)max_iter);
      return;
    }
    dVar11 = scalar_product(v1,buffer,size);
    pdVar4 = buffer;
    uVar5 = uVar7;
    while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
      pdVar4[uVar1] =
           (pdVar4[uVar2] * -dVar13 + pdVar4[uVar1]) * ((dVar12 * dVar11) / (dVar10 * dVar13)) +
           *pdVar4;
      pdVar4 = pdVar4 + 1;
    }
    (*precond)(matrix,buffer + uVar1,vector,omega_precond);
    Sparse_matrix_Apply_to_vector(matrix,vector,newVector);
    dVar12 = scalar_product(v1,newVector,size);
    dVar12 = dVar11 / dVar12;
    pdVar4 = buffer;
    uVar5 = uVar7;
    while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
      pdVar4[size * 6] = pdVar4[uVar2] * -dVar12 + *pdVar4;
      pdVar4 = pdVar4 + 1;
    }
    (*precond)(matrix,v2,vector_00,omega_precond);
    Sparse_matrix_Apply_to_vector(matrix,vector_00,newVector_00);
    dVar13 = scalar_product(newVector_00,v2,size);
    dVar10 = scalar_product(newVector_00,newVector_00,size);
    dVar13 = dVar13 / dVar10;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      x[uVar5] = vector[uVar5] * dVar12 + vector_00[uVar5] * dVar13 + x[uVar5];
    }
    dVar10 = scalar_product(buffer,buffer,size);
    if (dVar10 < accuracy * accuracy * dVar9) break;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      buffer[uVar5] = newVector_00[uVar5] * -dVar13 + v2[uVar5];
    }
    uVar3 = uVar3 + 1;
    dVar10 = dVar11;
  }
  return;
}

Assistant:

void Iterative_method_BiCGSTAB (
    Sparse_matrix const * matrix,
    double              * x,
    double const        * b,
    unsigned              max_iter,
    Precond_type          precond,
    double                omega_precond, /* default = 1 */
    double                accuracy,
    double              * buffer /* we need 8 * size */
  ) {

  register unsigned size   = matrix->size;
  register double alpha    = 1;
  register double rho      = 1;
  register double omega    = 1;
  double *r       = buffer;
  double *rcap    = buffer + size;
  double *v       = buffer + size * 2;
  double *p       = buffer + size * 3;
  double *y       = buffer + size * 4;
  double *z       = buffer + size * 5;
  double *s       = buffer + size * 6;
  double *t       = buffer + size * 7;

  register unsigned i, iter;
  register double beta, rhoold;

  register const double bnorm2 = scalar_product(b, b, size);
  register const double accuracy2 = accuracy * accuracy;

  Sparse_matrix_Apply_to_vector (matrix, x, r);
  memset (v, 0, size * sizeof(double));
  memset (p, 0, size * sizeof(double));
  for (i = 0; i < size; ++i) {
    r[i] = b[i] - r[i];
    rcap[i] = r[i];
  }

  for (iter = 1; iter < max_iter; ++iter) {
    rhoold = rho;
    rho = scalar_product (rcap, r, size);
    // beta = (rho / rhoold) * (alpha / omega);
    // should be faster:
    beta = (rho * alpha) / (rhoold * omega);
    for (i = 0; i < size; ++i) {
      p[i] = r[i] + beta * (p[i] - omega * v[i]);
    }
    (*precond)(matrix, p, y, omega_precond);
    Sparse_matrix_Apply_to_vector (matrix, y, v);
    alpha = rho / scalar_product (rcap, v, size);
    for (i = 0; i < size; ++i) {
      s[i] = r[i] - alpha * v[i];
    }
    (*precond)(matrix, s, z, omega_precond);
    Sparse_matrix_Apply_to_vector (matrix, z, t);
    omega = scalar_product (t, s, size) /
            scalar_product (t, t, size);
    for (i = 0; i < size; ++i) {
      x[i] += (alpha * y[i] + omega * z[i]);
    }
    if (scalar_product(r, r, size) < accuracy2 * bnorm2) {
      return;
    }
    for (i = 0; i < size; ++i) {
      r[i] = s[i] - omega * t[i];
    }
  }
  printf ("\nWarning: maximum number of iterations reached: %u.\n", max_iter);
}